

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLogTestCase.cpp
# Opt level: O2

void __thiscall
SuiteFileLogTests::generateFileNameFixture::~generateFileNameFixture(generateFileNameFixture *this)

{
  allocator<char> local_4a;
  allocator<char> local_49;
  string local_48;
  string local_28;
  
  FIX::FileLogFactory::destroy((Log *)this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"GENERATEFILENAME",&local_49);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"TEST",&local_4a);
  deleteLogSession(&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  FIX::FileLogFactory::~FileLogFactory(&this->fileLogFactory);
  return;
}

Assistant:

~generateFileNameFixture()
  {
    fileLogFactory.destroy( object );
    deleteLogSession( "GENERATEFILENAME", "TEST" );
  }